

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

bool maxValueScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  pointer piVar8;
  HighsLogOptions *log_options_;
  bool bVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  size_type sVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined8 uVar20;
  double dVar21;
  double dVar22;
  undefined8 uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  vector<double,_std::allocator<double>_> row_max_value;
  allocator_type local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  vector<double,_std::allocator<double>_> local_50;
  value_type_conflict1 local_38;
  
  local_98._8_8_ = local_98._0_8_;
  iVar11 = lp->num_col_;
  lVar14 = (long)iVar11;
  iVar1 = lp->num_row_;
  local_c8 = ldexp(1.0,(options->super_HighsOptionsStruct).allowed_matrix_scale_factor);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_50,(long)iVar1,&local_38,&local_d9);
  local_d8 = 0.0;
  dVar17 = 0.0;
  local_d0 = INFINITY;
  dVar21 = INFINITY;
  if (0 < lVar14) {
    piVar8 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar17 = 0.0;
    dVar21 = INFINITY;
    lVar12 = 0;
    iVar10 = *piVar8;
    do {
      iVar2 = piVar8[lVar12 + 1];
      if (iVar10 < iVar2) {
        lVar13 = (long)iVar10;
        do {
          iVar10 = piVar3[lVar13];
          dVar24 = ABS(pdVar4[lVar13]);
          dVar19 = dVar24;
          if (dVar24 <= local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar10]) {
            dVar19 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10];
          }
          local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] = dVar19;
          dVar19 = dVar24;
          if (dVar21 <= dVar24) {
            dVar19 = dVar21;
          }
          dVar21 = dVar19;
          if (dVar24 <= dVar17) {
            dVar24 = dVar17;
          }
          dVar17 = dVar24;
          lVar13 = lVar13 + 1;
        } while (iVar2 != lVar13);
      }
      lVar12 = lVar12 + 1;
      iVar10 = iVar2;
    } while (lVar12 != lVar14);
  }
  dVar19 = 0.0;
  local_98._0_8_ = 1.0 / local_c8;
  dStack_70 = 0.0;
  uStack_80 = 0;
  local_88 = dVar21;
  local_78 = dVar17;
  if (0 < iVar1) {
    local_d0 = INFINITY;
    sVar15 = 0;
    local_d8 = 0.0;
    do {
      dVar24 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar15];
      if ((dVar24 != 0.0) || (NAN(dVar24))) {
        dVar21 = log(1.0 / dVar24);
        dVar21 = floor(dVar21 / 0.6931471805599453 + 0.5);
        dVar21 = exp2(dVar21);
        if (dVar21 <= (double)local_98._0_8_) {
          dVar21 = (double)local_98._0_8_;
        }
        dVar17 = local_c8;
        if (dVar21 <= local_c8) {
          dVar17 = dVar21;
        }
        if (dVar17 <= local_d0) {
          local_d0 = dVar17;
        }
        if (local_d8 <= dVar17) {
          local_d8 = dVar17;
        }
        (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar15] = dVar17;
        dVar21 = local_88;
        dVar17 = local_78;
        dVar19 = dStack_70;
      }
      sVar15 = sVar15 + 1;
    } while ((long)iVar1 != sVar15);
  }
  if (iVar11 < 1) {
    auVar26._0_8_ = dVar17 / dVar21;
    auVar26._8_8_ = dVar19;
    dVar21 = 0.0;
    dVar17 = auVar26._0_8_ / 0.0;
    if (1.0 < dVar17) {
      dVar18 = INFINITY;
      uVar20 = 0;
      dVar22 = 0.0;
      uVar23 = 0;
      dVar24 = 0.0;
      dVar28 = INFINITY;
      goto LAB_00240fc6;
    }
  }
  else {
    piVar8 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar18 = INFINITY;
    uVar20 = 0;
    dVar22 = 0.0;
    uVar23 = 0;
    dVar24 = 0.0;
    dVar28 = INFINITY;
    lVar12 = 0;
    do {
      lVar13 = (long)piVar8[lVar12];
      lVar16 = lVar12 + 1;
      iVar1 = piVar8[lVar12 + 1];
      if (piVar8[lVar12] < iVar1) {
        piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar19 = 0.0;
        do {
          dVar27 = pdVar5[piVar3[lVar13]] * pdVar4[lVar13];
          pdVar4[lVar13] = dVar27;
          dVar27 = ABS(dVar27);
          if (dVar27 <= dVar19) {
            dVar27 = dVar19;
          }
          lVar13 = lVar13 + 1;
          dVar19 = dVar27;
        } while (iVar1 != lVar13);
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          local_b8 = dVar22;
          uStack_b0 = uVar23;
          local_a8 = dVar18;
          uStack_a0 = uVar20;
          local_68 = dVar24;
          local_58 = dVar28;
          dVar21 = log(1.0 / dVar27);
          dVar21 = floor(dVar21 / 0.6931471805599453 + 0.5);
          dVar21 = exp2(dVar21);
          if (dVar21 <= (double)local_98._0_8_) {
            dVar21 = (double)local_98._0_8_;
          }
          dVar17 = local_c8;
          if (dVar21 <= local_c8) {
            dVar17 = dVar21;
          }
          dVar28 = local_58;
          if (dVar17 <= local_58) {
            dVar28 = dVar17;
          }
          dVar24 = local_68;
          if (local_68 <= dVar17) {
            dVar24 = dVar17;
          }
          pdVar4 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[lVar12] = dVar17;
          piVar8 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = (long)piVar8[lVar12];
          iVar1 = piVar8[lVar16];
          dVar18 = local_a8;
          uVar20 = uStack_a0;
          dVar21 = local_88;
          dVar22 = local_b8;
          uVar23 = uStack_b0;
          dVar17 = local_78;
          if (piVar8[lVar12] < iVar1) {
            pdVar5 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar19 = local_a8;
            dVar27 = local_b8;
            do {
              dVar22 = pdVar4[lVar12] * pdVar5[lVar13];
              pdVar5[lVar13] = dVar22;
              dVar22 = ABS(dVar22);
              uVar23 = 0;
              uVar20 = 0;
              dVar18 = dVar22;
              if (dVar19 <= dVar22) {
                dVar18 = dVar19;
              }
              if (dVar22 <= dVar27) {
                dVar22 = dVar27;
              }
              lVar13 = lVar13 + 1;
              dVar19 = dVar18;
              dVar27 = dVar22;
            } while (iVar1 != lVar13);
          }
        }
      }
      lVar12 = lVar16;
    } while (lVar16 != lVar14);
    auVar25._8_8_ = dVar22;
    auVar25._0_8_ = dVar17;
    auVar7._8_8_ = dVar18;
    auVar7._0_8_ = dVar21;
    auVar26 = divpd(auVar25,auVar7);
    dVar19 = auVar26._8_8_;
    dVar17 = auVar26._0_8_ / dVar19;
    dVar21 = dVar19;
    if (1.0 < dVar17) {
LAB_00240fc6:
      bVar9 = true;
      if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
        log_options_ = &(options->super_HighsOptionsStruct).log_options;
        local_c8 = dVar17;
        dStack_c0 = dVar19;
        local_b8 = dVar22;
        uStack_b0 = uVar23;
        local_a8 = dVar18;
        uStack_a0 = uVar20;
        local_98 = auVar26;
        local_68 = dVar21;
        dStack_60 = dVar21;
        highsLogDev(log_options_,kInfo,
                    "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                    ,dVar28,dVar24,local_d0,local_d8);
        highsLogDev(log_options_,kInfo,
                    "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
                    ,local_a8,local_b8,local_68,local_88,local_78,local_98._0_8_,local_c8);
      }
      goto LAB_0024109d;
    }
    if (0 < iVar11) {
      piVar8 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = 0;
      iVar11 = *piVar8;
      do {
        iVar1 = piVar8[lVar12 + 1];
        if (iVar11 < iVar1) {
          lVar13 = (long)iVar11;
          do {
            pdVar6[lVar13] = pdVar6[lVar13] / (pdVar4[lVar12] * pdVar5[piVar3[lVar13]]);
            lVar13 = lVar13 + 1;
          } while (iVar1 != lVar13);
        }
        lVar12 = lVar12 + 1;
        iVar11 = iVar1;
      } while (lVar12 != lVar14);
    }
  }
  if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
                "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n",dVar17
                ,0x3ff0000000000000);
  }
  bVar9 = false;
LAB_0024109d:
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

bool maxValueScaleMatrix(const HighsOptions& options, HighsLp& lp,
                         const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;

  assert(options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue015 ||
         options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue0157);

  // The 015(7) values refer to bit settings in FICO's scaling options.
  // Specifically
  //
  // 0: Row scaling
  //
  // 1: Column scaling
  //
  // 5: Scale by maximum element
  //
  // 7: Scale objective function for the simplex method
  //
  // Note that 7 is not yet implemented, so
  // kSimplexScaleStrategyMaxValue015 and
  // kSimplexScaleStrategyMaxValue0157 are equivalent. However, cost
  // scaling could be well worth adding, now that the unscaled problem
  // can be solved using scaled NLA

  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;
  const double min_allow_row_scale = min_allow_scale;
  const double max_allow_row_scale = max_allow_scale;

  double min_row_scale = kHighsInf;
  double max_row_scale = 0;
  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  // Determine the row scaling. Also determine the max/min row scaling
  // factors, and max/min original matrix values
  vector<double> row_max_value(numRow, 0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      const double value = fabs(Avalue[k]);
      row_max_value[iRow] = max(row_max_value[iRow], value);
      original_matrix_min_value = min(original_matrix_min_value, value);
      original_matrix_max_value = max(original_matrix_max_value, value);
    }
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (row_max_value[iRow]) {
      double row_scale_value = 1 / row_max_value[iRow];
      // Convert the row scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      row_scale_value = pow(2.0, floor(log(row_scale_value) / log2 + 0.5));
      row_scale_value =
          min(max(min_allow_row_scale, row_scale_value), max_allow_row_scale);
      min_row_scale = min(row_scale_value, min_row_scale);
      max_row_scale = max(row_scale_value, max_row_scale);
      rowScale[iRow] = row_scale_value;
    }
  }
  // Determine the column scaling, whilst applying the row scaling
  // Also determine the max/min column scaling factors, and max/min
  // matrix values
  double min_col_scale = kHighsInf;
  double max_col_scale = 0;
  double matrix_min_value = kHighsInf;
  double matrix_max_value = 0;
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double col_max_value = 0;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      Avalue[k] *= rowScale[iRow];
      const double value = fabs(Avalue[k]);
      col_max_value = max(col_max_value, value);
    }
    if (col_max_value) {
      double col_scale_value = 1 / col_max_value;
      // Convert the col scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
      col_scale_value =
          min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
      min_col_scale = min(col_scale_value, min_col_scale);
      max_col_scale = max(col_scale_value, max_col_scale);
      colScale[iCol] = col_scale_value;
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        Avalue[k] *= colScale[iCol];
        const double value = fabs(Avalue[k]);
        matrix_min_value = min(matrix_min_value, value);
        matrix_max_value = max(matrix_max_value, value);
      }
    }
  }
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;

  const double improvement_factor = matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor <= improvement_factor_required;

  if (poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(
          options.log_options, HighsLogType::kInfo,
          "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
          "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
          matrix_min_value, matrix_max_value, matrix_value_ratio,
          original_matrix_min_value, original_matrix_max_value,
          original_matrix_value_ratio, matrix_value_ratio_improvement);
    }
    return true;
  }
}